

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_helper.h
# Opt level: O3

void integralEquationIteration<long_double>
               (QuickselectParams<long_double> *quickselectParams,
               vector<long_double,_std::allocator<long_double>_> *fOld,
               vector<long_double,_std::allocator<long_double>_> *fNewOut)

{
  long lVar1;
  QuickselectParams<long_double> *pQVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  pointer plVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  longdouble in_ST0;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  longdouble lVar21;
  longdouble lVar22;
  longdouble lVar23;
  longdouble in_ST1;
  longdouble lVar24;
  longdouble lVar25;
  longdouble lVar26;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar27;
  longdouble in_ST4;
  double dVar28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t;
  longdouble local_248;
  longdouble local_23c;
  ulong local_1c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  longdouble local_188;
  longdouble local_17c;
  longdouble local_170;
  longdouble local_164;
  long local_158;
  longdouble local_14c;
  long local_140;
  vector<long_double,_std::allocator<long_double>_> *local_138;
  QuickselectParams<long_double> *local_130;
  double local_128;
  double local_120;
  pointer local_118;
  double local_110;
  double local_108;
  ulong local_100;
  double local_f8;
  long local_f0;
  ulong local_e8;
  long local_e0;
  double local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d0;
  longdouble local_b4;
  longdouble local_a8;
  longdouble local_9c;
  longdouble local_90;
  longdouble local_84;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_e8 = (long)(fNewOut->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(fNewOut->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  local_140 = (long)local_e8 >> 4;
  local_d8 = 1.0 / (double)local_140;
  local_14c = (longdouble)local_d8;
  if (0 < local_140) {
    lVar12 = (long)(fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 4;
    local_e8 = local_e8 >> 3;
    local_b4 = (longdouble)local_e8;
    local_170 = (longdouble)lVar12;
    lVar1 = lVar12 + -1;
    local_158 = 0;
    local_138 = fNewOut;
    local_130 = quickselectParams;
    local_e0 = lVar12;
    do {
      pQVar2 = local_130;
      local_f0 = local_158 * 2 + 1;
      lVar24 = (longdouble)local_f0 / local_b4;
      (*local_130->_vptr_QuickselectParams[1])(&local_1a0,local_130);
      uVar16 = (long)local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      (**pQVar2->_vptr_QuickselectParams)(pQVar2);
      uVar5 = *local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_d0,&local_1a0);
      uVar14 = 1;
      uVar3 = tRight(&local_d0,1);
      if (local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        uVar14 = (long)local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                 (long)local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        operator_delete(local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,uVar14);
      }
      uVar7 = uVar16 >> 2;
      uVar6 = uVar3 + 1;
      uVar9 = uVar5 + 1;
      do {
        uVar15 = uVar9;
        uVar9 = uVar6;
        uVar6 = uVar15;
      } while (uVar9 < uVar15);
      lVar17 = local_14c * ((longdouble)1 - lVar24);
      local_f8 = 1.0 / (double)uVar9;
      lVar18 = (longdouble)local_f8;
      if (1 < uVar15) {
        iVar4 = uVar15 - 1;
        lVar19 = (longdouble)1;
        do {
          uVar9 = uVar9 + 1;
          local_100 = (ulong)uVar9;
          lVar18 = (lVar19 / (longdouble)local_100) * lVar18;
          lVar19 = lVar19 + (longdouble)1;
          iVar4 = iVar4 + -1;
          in_ST4 = in_ST3;
        } while (iVar4 != 0);
      }
      local_164 = ((longdouble)1 - lVar24) / lVar17;
      lVar19 = (longdouble)0;
      lVar21 = in_ST1;
      lVar25 = in_ST2;
      lVar22 = in_ST3;
      lVar23 = in_ST4;
      if (lVar19 < local_164) {
        iVar4 = 1;
        lVar20 = (longdouble)0;
        lVar19 = lVar20;
        lVar26 = in_ST4;
        lVar27 = in_ST4;
        do {
          lVar21 = in_ST3;
          lVar25 = lVar24 + lVar17 * (longdouble)0.5 + lVar17 * lVar20;
          local_108 = (double)(local_170 * (lVar24 / lVar25));
          lVar23 = lVar27;
          in_ST4 = lVar27;
          dVar28 = floor(local_108);
          lVar8 = (long)dVar28;
          if (lVar12 <= (long)dVar28) {
            lVar8 = lVar1;
          }
          lVar22 = (fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar8];
          pow<long_double>((longdouble *)(ulong)(uVar5 + 1),lVar25,(uint)uVar14);
          pow<long_double>((longdouble *)(ulong)uVar3,(longdouble)1 - lVar25,(uint)uVar14);
          lVar19 = lVar19 + in_ST1 * lVar22 * in_ST2;
          lVar20 = (longdouble)iVar4;
          iVar4 = iVar4 + 1;
          in_ST1 = lVar21;
          lVar25 = lVar26;
          in_ST2 = lVar26;
          lVar22 = lVar27;
          in_ST3 = lVar27;
          lVar26 = lVar23;
          lVar27 = in_ST4;
        } while (lVar20 < local_164);
      }
      in_ST3 = lVar23;
      in_ST2 = lVar22;
      in_ST1 = lVar25;
      lVar18 = in_ST0 + (lVar17 / lVar18) * lVar19;
      iVar4 = *(int *)((long)local_1a0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start +
                      ((long)(uVar16 * 0x40000000 + -0x100000000) >> 0x1e));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,&local_1a0);
      uVar3 = (uint)uVar7;
      uVar7 = uVar7 & 0xffffffff;
      uVar5 = tLeft(&local_48,uVar3);
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        uVar7 = (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,uVar7);
      }
      uVar15 = iVar4 + 1;
      uVar9 = uVar5 + 1;
      uVar6 = uVar15;
      do {
        uVar11 = uVar6;
        uVar6 = uVar9;
        plVar10 = (pointer)(ulong)uVar6;
        uVar9 = uVar11;
      } while (uVar6 < uVar11);
      lVar25 = lVar24 * local_14c;
      local_110 = 1.0 / (double)uVar6;
      lVar19 = (longdouble)local_110;
      if (1 < uVar11) {
        iVar4 = uVar11 - 1;
        plVar10 = (pointer)(ulong)(uVar6 + 1);
        lVar22 = (longdouble)1;
        do {
          local_118 = plVar10;
          lVar19 = (lVar22 / (longdouble)(long)local_118) * lVar19;
          lVar22 = lVar22 + (longdouble)1;
          plVar10 = (pointer)(ulong)((int)local_118 + 1);
          iVar4 = iVar4 + -1;
          in_ST4 = in_ST3;
        } while (iVar4 != 0);
      }
      local_17c = lVar24 / lVar25;
      local_23c = (longdouble)0;
      in_ST0 = lVar21;
      if (local_23c < local_17c) {
        lVar22 = (longdouble)0;
        lVar20 = lVar25 * (longdouble)0.5 + lVar22;
        iVar4 = 1;
        lVar23 = in_ST1;
        local_23c = lVar22;
        do {
          in_ST1 = in_ST3;
          in_ST0 = in_ST2;
          lVar22 = lVar20 + lVar25 * lVar22;
          local_120 = (double)(local_170 * ((lVar24 - lVar22) / ((longdouble)1 - lVar22)));
          in_ST2 = in_ST1;
          in_ST3 = in_ST1;
          in_ST4 = in_ST1;
          dVar28 = floor(local_120);
          lVar8 = (long)dVar28;
          if (lVar12 <= (long)dVar28) {
            lVar8 = lVar1;
          }
          plVar10 = (fOld->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar26 = plVar10[lVar8];
          pow<long_double>((longdouble *)(ulong)uVar15,(longdouble)1 - lVar22,(uint)uVar7);
          pow<long_double>((longdouble *)(ulong)uVar5,lVar22,(uint)uVar7);
          local_23c = local_23c + lVar21 * lVar26 * lVar23;
          lVar22 = (longdouble)iVar4;
          iVar4 = iVar4 + 1;
          lVar21 = in_ST0;
          lVar23 = in_ST1;
        } while (lVar22 < local_17c);
      }
      local_188 = lVar18 + local_23c * (lVar25 / lVar19);
      if (2 < (int)uVar3) {
        local_a8 = lVar25 * lVar17;
        local_90 = (longdouble)0 + lVar25 * (longdouble)0.5;
        local_84 = lVar24 + (longdouble)0.5 * lVar17;
        local_1c8 = 2;
        in_ST4 = in_ST3;
        do {
          lVar18 = in_ST4;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,&local_1a0);
          uVar5 = tLeft(&local_60,(int)local_1c8);
          if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar9 = local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_1c8 - 1];
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_78,&local_1a0);
          uVar6 = tRight(&local_78,(int)local_1c8);
          if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar9 = uVar9 + 1;
          uVar14 = (ulong)uVar9;
          beta<long_double>((longdouble *)(ulong)(uVar5 + 1),uVar9,uVar6 + 1,(uint)plVar10);
          local_248 = (longdouble)0;
          local_9c = local_a8 / in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          lVar19 = in_ST3;
          lVar21 = in_ST4;
          if (local_248 < local_17c) {
            iVar4 = 0;
            lVar22 = (longdouble)0;
            local_248 = lVar22;
            do {
              lVar19 = (longdouble)0;
              if (lVar19 < local_164) {
                lVar20 = local_90 + lVar25 * lVar22;
                iVar13 = 1;
                lVar21 = in_ST0;
                lVar22 = in_ST2;
                lVar23 = in_ST3;
                lVar18 = in_ST4;
                do {
                  in_ST2 = lVar18;
                  in_ST0 = in_ST4;
                  lVar19 = local_84 + lVar17 * lVar19;
                  lVar26 = lVar19 - lVar20;
                  local_128 = (double)(local_170 * ((lVar24 - lVar20) / lVar26));
                  in_ST3 = in_ST2;
                  in_ST4 = in_ST2;
                  dVar28 = floor(local_128);
                  lVar8 = (long)dVar28;
                  if (lVar12 <= (long)dVar28) {
                    lVar8 = lVar1;
                  }
                  plVar10 = (fOld->super__Vector_base<long_double,_std::allocator<long_double>_>).
                            _M_impl.super__Vector_impl_data._M_start;
                  lVar27 = plVar10[lVar8];
                  lVar18 = in_ST4;
                  pow<long_double>((longdouble *)(ulong)uVar5,lVar20,(uint)uVar14);
                  pow<long_double>((longdouble *)(ulong)uVar9,lVar26,(uint)uVar14);
                  pow<long_double>((longdouble *)(ulong)uVar6,(longdouble)1 - lVar19,(uint)uVar14);
                  local_248 = local_248 + lVar22 * lVar21 * lVar27 * lVar23;
                  lVar19 = (longdouble)iVar13;
                  iVar13 = iVar13 + 1;
                  lVar21 = in_ST0;
                  lVar22 = in_ST2;
                  lVar23 = in_ST3;
                } while (lVar19 < local_164);
              }
              iVar4 = iVar4 + 1;
              lVar22 = (longdouble)iVar4;
              in_ST1 = in_ST2;
              lVar19 = in_ST3;
              lVar21 = in_ST4;
            } while (lVar22 < local_17c);
          }
          in_ST4 = lVar18;
          in_ST3 = lVar21;
          in_ST2 = lVar19;
          local_188 = local_188 + local_248 * local_9c;
          local_1c8 = local_1c8 + 1;
        } while (local_1c8 != (uVar3 & 0x7fffffff));
      }
      (local_138->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
      super__Vector_impl_data._M_start[local_158] = local_188;
      if (local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1a0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_158 = local_158 + 1;
    } while (local_158 != local_140);
  }
  return;
}

Assistant:

void integralEquationIteration(const QuickselectParams<Num> * quickselectParams,
                               const vector<Num> & fOld, vector<Num> & fNewOut) {
	const long L = fNewOut.size();
	const long LOld = fOld.size();
	const Num Delta = 1.0 / L;

	for (int i = 0; i < L; ++i) {
		auto alpha = alphaForIndex<Num>(i, L);
		const vector<unsigned int> t = quickselectParams->samplingParameter(alpha);
		auto s = static_cast<int>(t.size());

		// partitioning costs
		Num newValue = quickselectParams->partitioningCosts(alpha);
		// first integral (left call)
		{
			const unsigned int t1 = t[0], t2 = tRight(t, 1) ;
			Num step = Delta * (1 - alpha);
			const Num commonFactor = step / beta<Num>(t1 + 1, t2 + 1);
			Num sum = 0;
			for (int j = 0; j < (1-alpha) / step; ++j) {
				Num u = alpha + step/2 + j*step;
//			}
//			for (Num u = alpha + step / 2; u < 1; u += step) {
				Num summand = fOld[indexForAlpha(alpha / u, LOld)]
				              * pow(u,t1+1) * pow(1-u,t2);
				sum += summand;
			}
			newValue += sum * commonFactor;
		}
		// second integral (right call)
		{
			const unsigned int t1 = t[s-1], t2 = tLeft(t, s) ;
			Num step = Delta * alpha;
			const Num commonFactor = step / beta<Num>(t1 + 1, t2 + 1);
			Num sum = 0;
			for (int j = 0; j < alpha / step; ++j) {
				Num v = 0 + step/2 + j*step;
//			for (Num v = 0 + step / 2; v < alpha; v += step) {
				Num summand = fOld[indexForAlpha((alpha-v) / (1-v), LOld)]
				              * pow(1-v,t1+1) * pow(v,t2);
				sum += summand;
			}
			newValue += sum * commonFactor;
		}
		// third integrals (middle calls)
		for (int l = 2; l <= s-1; ++l) {
			const unsigned int t1 = tLeft(t,l), t2 = t[l-1], t3 = tRight(t,l) ;
			Num step1 = Delta * alpha, step2 = Delta * (1-alpha);
			const Num commonFactor = step1 * step2 / beta<Num>(t1 + 1, t2 + 1, t3 + 1);
			Num sum = 0;
			for (int j1 = 0; j1 < alpha / step1; ++j1) {
				for (int j2 = 0; j2 < (1 - alpha) / step2; ++j2) {
					Num u = 0 + step1 / 2 + j1 * step1;
					Num v = alpha + step2 / 2 + j2 * step2;
					Num summand = fOld[indexForAlpha((alpha - u) / (v - u), LOld)]
					              * pow(u,t1) * pow(v - u, t2 + 1) * pow(1-v, t3) ;
					sum += summand;
				}
			}
			newValue += sum * commonFactor;
		}

		fNewOut[i] = newValue;
	}

}